

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

uint syncsearch(uint *have,uchar *buf,uint len)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uchar uVar4;
  
  uVar2 = *have;
  uVar1 = 0;
  while ((uVar1 < len && (uVar2 < 4))) {
    uVar4 = 0xff;
    if (uVar2 < 2) {
      uVar4 = '\0';
    }
    uVar3 = 4 - uVar2;
    if (buf[uVar1] != '\0') {
      uVar3 = 0;
    }
    uVar2 = uVar2 + 1;
    if (uVar4 != buf[uVar1]) {
      uVar2 = uVar3;
    }
    uVar1 = uVar1 + 1;
  }
  *have = uVar2;
  return (uint)uVar1;
}

Assistant:

local unsigned syncsearch(have, buf, len)
unsigned FAR *have;
const unsigned char FAR *buf;
unsigned len;
{
    unsigned got;
    unsigned next;

    got = *have;
    next = 0;
    while (next < len && got < 4) {
        if ((int)(buf[next]) == (got < 2 ? 0 : 0xff))
            got++;
        else if (buf[next])
            got = 0;
        else
            got = 4 - got;
        next++;
    }
    *have = got;
    return next;
}